

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_enclosing
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *param,REF_INT *cell,
          REF_DBL *bary)

{
  REF_CELL pRVar1;
  uint uVar2;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT best_candidate;
  REF_DBL min_bary;
  REF_DBL best_bary;
  REF_DBL current_bary [3];
  REF_INT local_f8 [2];
  REF_INT nodes [27];
  int local_84;
  REF_INT candidate;
  REF_INT item;
  REF_DBL fuzz;
  REF_DBL parampad [3];
  REF_CELL ref_cell;
  REF_SEARCH ref_search;
  REF_LIST ref_list;
  REF_GEOM ref_geom;
  REF_DBL *bary_local;
  REF_INT *cell_local;
  REF_DBL *param_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_FACELIFT ref_facelift_local;
  
  ref_list = (REF_LIST)ref_facelift->grid->geom;
  *cell = -1;
  *bary = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;
  ref_geom = (REF_GEOM)bary;
  bary_local = (REF_DBL *)cell;
  cell_local = (REF_INT *)param;
  param_local._0_4_ = id;
  param_local._4_4_ = type;
  _id_local = ref_facelift;
  if (type == 1) {
    uVar2 = ref_list_create((REF_LIST *)&ref_search);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x224,"ref_facelift_enclosing",(ulong)uVar2,"create list");
      return uVar2;
    }
    pRVar1 = _id_local->edg_cell;
    fuzz = *(REF_DBL *)cell_local;
    parampad[0] = 0.0;
    parampad[1] = 0.0;
    uVar2 = ref_search_touching(_id_local->edge_search[(REF_INT)param_local + -1],
                                (REF_LIST)ref_search,&fuzz,1e-12);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x22b,"ref_facelift_enclosing",(ulong)uVar2,"touching");
      return uVar2;
    }
    if (ref_search->d < 1) {
      uVar2 = ref_list_free((REF_LIST)ref_search);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x22d,"ref_facelift_enclosing",(ulong)uVar2,"free list");
        return uVar2;
      }
      return 0;
    }
    ref_private_macro_code_rss = -1;
    min_bary = -999.0;
    for (local_84 = 0; local_84 < ref_search->d; local_84 = local_84 + 1) {
      nodes[0x1a] = *(REF_INT *)(*(long *)&ref_search->empty + (long)local_84 * 4);
      uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],local_f8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x234,"ref_facelift_enclosing",(ulong)uVar2,"cell");
        return uVar2;
      }
      nodes[0] = nodes[(long)pRVar1->node_per + -2];
      uVar2 = ref_geom_bary2((REF_GEOM)ref_list,local_f8,*(REF_DBL *)cell_local,&best_bary);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x236,"ref_facelift_enclosing",(ulong)uVar2,"bary");
        return uVar2;
      }
      if (current_bary[0] <= best_bary) {
        local_178 = current_bary[0];
      }
      else {
        local_178 = best_bary;
      }
      if ((ref_private_macro_code_rss == -1) || (min_bary < local_178)) {
        ref_private_macro_code_rss = nodes[0x1a];
        min_bary = local_178;
      }
    }
    if (ref_private_macro_code_rss == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x23e,"ref_facelift_enclosing","failed to find cell");
      return 1;
    }
    *(REF_STATUS *)bary_local = ref_private_macro_code_rss;
    uVar2 = ref_cell_nodes(pRVar1,ref_private_macro_code_rss,local_f8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x241,"ref_facelift_enclosing",(ulong)uVar2,"cell");
      return uVar2;
    }
    nodes[0] = nodes[(long)pRVar1->node_per + -2];
    uVar2 = ref_geom_bary2((REF_GEOM)ref_list,local_f8,*(REF_DBL *)cell_local,(REF_DBL *)ref_geom);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x243,"ref_facelift_enclosing",(ulong)uVar2,"bary");
      return uVar2;
    }
    uVar2 = ref_list_free((REF_LIST)ref_search);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x245,"ref_facelift_enclosing",(ulong)uVar2,"free list");
      return uVar2;
    }
  }
  if (param_local._4_4_ == 2) {
    uVar2 = ref_list_create((REF_LIST *)&ref_search);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x249,"ref_facelift_enclosing",(ulong)uVar2,"create list");
      return uVar2;
    }
    pRVar1 = _id_local->tri_cell;
    fuzz = *(REF_DBL *)cell_local;
    parampad[0] = *(REF_DBL *)(cell_local + 2);
    parampad[1] = 0.0;
    uVar2 = ref_search_touching(_id_local->face_search[(REF_INT)param_local + -1],
                                (REF_LIST)ref_search,&fuzz,1e-12);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x250,"ref_facelift_enclosing",(ulong)uVar2,"touching");
      return uVar2;
    }
    if (ref_search->d < 1) {
      uVar2 = ref_list_free((REF_LIST)ref_search);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x253,"ref_facelift_enclosing",(ulong)uVar2,"free list");
        return uVar2;
      }
      return 0;
    }
    ref_private_macro_code_rss = -1;
    min_bary = -999.0;
    for (local_84 = 0; local_84 < ref_search->d; local_84 = local_84 + 1) {
      nodes[0x1a] = *(REF_INT *)(*(long *)&ref_search->empty + (long)local_84 * 4);
      uVar2 = ref_cell_nodes(pRVar1,nodes[0x1a],local_f8);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x25a,"ref_facelift_enclosing",(ulong)uVar2,"cell");
        return uVar2;
      }
      nodes[1] = nodes[(long)pRVar1->node_per + -2];
      uVar2 = ref_geom_bary3((REF_GEOM)ref_list,local_f8,(REF_DBL *)cell_local,&best_bary);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x25c,"ref_facelift_enclosing",(ulong)uVar2,"bary");
        return uVar2;
      }
      if (current_bary[0] <= best_bary) {
        local_180 = current_bary[0];
      }
      else {
        local_180 = best_bary;
      }
      if (current_bary[1] <= local_180) {
        local_190 = current_bary[1];
      }
      else {
        if (current_bary[0] <= best_bary) {
          local_188 = current_bary[0];
        }
        else {
          local_188 = best_bary;
        }
        local_190 = local_188;
      }
      if ((ref_private_macro_code_rss == -1) || (min_bary < local_190)) {
        ref_private_macro_code_rss = nodes[0x1a];
        min_bary = local_190;
      }
    }
    if (ref_private_macro_code_rss == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x267,"ref_facelift_enclosing","failed to find cell");
      return 1;
    }
    *(REF_STATUS *)bary_local = ref_private_macro_code_rss;
    uVar2 = ref_cell_nodes(pRVar1,ref_private_macro_code_rss,local_f8);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x26a,"ref_facelift_enclosing",(ulong)uVar2,"cell");
      return uVar2;
    }
    nodes[1] = nodes[(long)pRVar1->node_per + -2];
    uVar2 = ref_geom_bary3((REF_GEOM)ref_list,local_f8,(REF_DBL *)cell_local,(REF_DBL *)ref_geom);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x26c,"ref_facelift_enclosing",(ulong)uVar2,"bary");
      return uVar2;
    }
    uVar2 = ref_list_free((REF_LIST)ref_search);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x270,"ref_facelift_enclosing",(ulong)uVar2,"free list");
      return uVar2;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_enclosing(REF_FACELIFT ref_facelift,
                                          REF_INT type, REF_INT id,
                                          REF_DBL *param, REF_INT *cell,
                                          REF_DBL *bary) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_CELL ref_cell;
  REF_DBL parampad[3];
  REF_DBL fuzz = 1.0e-12;
  REF_INT item, candidate, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL current_bary[3], best_bary, min_bary;
  REF_INT best_candidate;
  REF_BOOL verbose = REF_FALSE;

  *cell = REF_EMPTY;
  bary[0] = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;

  if (REF_GEOM_EDGE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_edge_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_edg(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = 0.0;
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary2(ref_geom, nodes, param[0], current_bary), "bary");
      min_bary = MIN(current_bary[0], current_bary[1]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary2(ref_geom, nodes, param[0], bary), "bary");

    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_GEOM_FACE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_face_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_tri(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = param[1];
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (verbose) printf("n touch %d\n", ref_list_n(ref_list));
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary3(ref_geom, nodes, param, current_bary), "bary");
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (verbose)
        printf("bary %e %e %e\n", current_bary[0], current_bary[1],
               current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary3(ref_geom, nodes, param, bary), "bary");

    if (verbose) printf("best %e %e %e\n", bary[0], bary[1], bary[2]);

    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}